

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::FieldDescriptor::FieldTypeNameDebugString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this)

{
  char *pcVar1;
  bool bVar2;
  Type TVar3;
  Edition edition;
  FileDescriptor *this_00;
  Descriptor *this_01;
  EnumDescriptor *this_02;
  AlphaNum *b;
  allocator<char> local_111;
  string_view local_110;
  AlphaNum local_100;
  AlphaNum local_d0;
  string_view local_a0;
  AlphaNum local_90;
  AlphaNum local_60;
  allocator<char> local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *this_local;
  
  local_18 = this;
  this_local = (FieldDescriptor *)__return_storage_ptr__;
  TVar3 = type(this);
  b = (AlphaNum *)(ulong)TVar3;
  if (TVar3 - TYPE_GROUP < 2) {
    this_00 = file(this);
    edition = FileDescriptor::edition(this_00);
    bVar2 = anon_unknown_24::IsGroupSyntax(edition,this);
    if (bVar2) {
      TVar3 = type(this);
      pcVar1 = *(char **)(kTypeToName + (ulong)TVar3 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,pcVar1,&local_19);
      std::allocator<char>::~allocator(&local_19);
    }
    else {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_60,".");
      this_01 = message_type(this);
      local_a0 = Descriptor::full_name(this_01);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_90,local_a0);
      absl::lts_20250127::StrCat_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)&local_60,&local_90,b);
    }
  }
  else if (TVar3 == TYPE_ENUM) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_d0,".");
    this_02 = enum_type(this);
    local_110 = EnumDescriptor::full_name(this_02);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_100,local_110);
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_d0,&local_100,b);
  }
  else {
    TVar3 = type(this);
    pcVar1 = *(char **)(kTypeToName + (ulong)TVar3 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar1,&local_111);
    std::allocator<char>::~allocator(&local_111);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDescriptor::FieldTypeNameDebugString() const {
  switch (type()) {
    case TYPE_MESSAGE:
    case TYPE_GROUP:
      if (IsGroupSyntax(file()->edition(), this)) {
        return kTypeToName[type()];
      }
      return absl::StrCat(".", message_type()->full_name());
    case TYPE_ENUM:
      return absl::StrCat(".", enum_type()->full_name());
    default:
      return kTypeToName[type()];
  }
}